

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O0

int per_binding(hash_key_t key,hash_data_t data,void *opaque)

{
  FILE *pFVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 *in_RSI;
  internal_binding_t *binding;
  int result;
  internal_binding_t *in_stack_00000258;
  hash_key_t in_stack_ffffffffffffff60;
  hash_table_t *in_stack_ffffffffffffff68;
  char *local_90;
  char *local_70;
  char *local_50;
  undefined8 *local_30;
  
  pFVar1 = _stderr;
  local_30 = in_RSI;
  if (2 < debug_level) {
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    local_50 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha_dl.c"
                       ,0x2f);
    if (local_50 == (char *)0x0) {
      local_50 = "";
    }
    in_stack_ffffffffffffff60 = (hash_key_t)**(undefined8 **)*in_RSI;
    fprintf(pFVar1,"[%d/%d][%s:%u] - Trying to re-bind %s from tool %s after dlopen\n",(ulong)uVar2,
            (ulong)uVar3,local_50 + 1,0x13,*(undefined8 *)in_RSI[1]);
  }
  while (pFVar1 = _stderr, local_30[2] != 0) {
    local_30 = (undefined8 *)local_30[2];
    if (2 < debug_level) {
      uVar2 = gotcha_gettid();
      uVar3 = getpid();
      local_70 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha_dl.c"
                         ,0x2f);
      if (local_70 == (char *)0x0) {
        local_70 = "";
      }
      in_stack_ffffffffffffff60 = (hash_key_t)**(undefined8 **)*local_30;
      fprintf(pFVar1,
              "[%d/%d][%s:%u] - Selecting new innermost version of binding %s from tool %s.\n",
              (ulong)uVar2,(ulong)uVar3,local_70 + 1,0x18,*(undefined8 *)local_30[1]);
    }
  }
  iVar4 = prepare_symbol(in_stack_00000258);
  pFVar1 = _stderr;
  if (iVar4 == -1) {
    if (2 < debug_level) {
      uVar2 = gotcha_gettid();
      uVar3 = getpid();
      local_90 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha_dl.c"
                         ,0x2f);
      if (local_90 == (char *)0x0) {
        local_90 = "";
      }
      fprintf(pFVar1,"[%d/%d][%s:%u] - Still could not prepare binding %s after dlopen\n",
              (ulong)uVar2,(ulong)uVar3,local_90 + 1,0x1d,*(undefined8 *)local_30[1]);
    }
  }
  else {
    removefrom_hashtable(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  }
  return 0;
}

Assistant:

static int per_binding(hash_key_t key, hash_data_t data, void *opaque KNOWN_UNUSED)
{
   int result;
   struct internal_binding_t *binding = (struct internal_binding_t *) data;

   debug_printf(3, "Trying to re-bind %s from tool %s after dlopen\n",
                binding->user_binding->name, binding->associated_binding_table->tool->tool_name);
   
   while (binding->next_binding) {
      binding = binding->next_binding;
      debug_printf(3, "Selecting new innermost version of binding %s from tool %s.\n",
                   binding->user_binding->name, binding->associated_binding_table->tool->tool_name);
   }
   
   result = prepare_symbol(binding);
   if (result == -1) {
      debug_printf(3, "Still could not prepare binding %s after dlopen\n", binding->user_binding->name);
      return 0;
   }

   removefrom_hashtable(&notfound_binding_table, key);
   return 0;
}